

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O1

void Abc_FlowRetime_ConstrainExact_back_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int latch)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((uVar1 & 0xf) == 8) {
    if (latch != 0) {
      return;
    }
    latch = 1;
  }
  if (latch == 0) {
    uVar4 = 0x10;
    uVar2 = uVar1 & 0x10;
  }
  else {
    uVar4 = 0x20;
    uVar2 = uVar1 & 0x20;
  }
  if (uVar2 != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = uVar1 | uVar4;
  if (0 < (pObj->vFanouts).nSize) {
    lVar6 = 0;
    do {
      Abc_FlowRetime_ConstrainExact_back_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]],vNodes,latch
                );
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pObj->vFanouts).nSize);
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff;
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_0047de64;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar3;
    }
    vNodes->nCap = iVar5;
  }
LAB_0047de64:
  iVar5 = vNodes->nSize;
  vNodes->nSize = iVar5 + 1;
  vNodes->pArray[iVar5] = (void *)((ulong)(latch != 0) ^ (ulong)pObj);
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact_back_rec( Abc_Obj_t * pObj, Vec_Ptr_t *vNodes, int latch ) {
  Abc_Obj_t *pNext;
  int i;

  // terminate?
  if (Abc_ObjIsLatch(pObj)) {
    if (latch) return;
    latch = 1;
  }

  // already visited?
  if (!latch) {
    if (pObj->fMarkA) return;
    pObj->fMarkA = 1;
  } else {
    if (pObj->fMarkB) return;
    pObj->fMarkB = 1;
  }

  // recurse
  Abc_ObjForEachFanout(pObj, pNext, i) {
    Abc_FlowRetime_ConstrainExact_back_rec( pNext, vNodes, latch );
  }

  // add
  pObj->Level = 0;
  Vec_PtrPush(vNodes, Abc_ObjNotCond(pObj, latch));
}